

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O2

void embree::convertHairSet(ISPCHairSet *hair,RTCScene scene_out)

{
  undefined8 uVar1;
  uint t;
  ulong uVar2;
  
  uVar1 = rtcNewGeometry(g_device,hair->type);
  for (uVar2 = 0; uVar2 < hair->numTimeSteps; uVar2 = uVar2 + 1) {
    rtcSetSharedGeometryBuffer
              (uVar1,1,uVar2 & 0xffffffff,0x9004,hair->positions[uVar2],0,0x10,hair->numVertices);
  }
  rtcSetSharedGeometryBuffer(uVar1,0,0,0x5001,hair->hairs,0,8);
  if (hair->flags != (uchar *)0x0) {
    rtcSetSharedGeometryBuffer(uVar1,0x20,0,0x1001,hair->flags,0,1);
  }
  rtcSetGeometryTessellationRate((float)hair->tessellation_rate,uVar1);
  rtcSetGeometryEnableFilterFunctionFromArguments(uVar1,1);
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(scene_out,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void convertHairSet(ISPCHairSet* hair, RTCScene scene_out)
{
  RTCGeometry geom = rtcNewGeometry (g_device, hair->type);
  for (unsigned int t=0; t<hair->numTimeSteps; t++) {
    rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,t,RTC_FORMAT_FLOAT4,hair->positions[t],0,sizeof(Vertex),hair->numVertices);
  }
  rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT,hair->hairs,0,sizeof(ISPCHair),hair->numHairs);
  if (hair->flags)
    rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_FLAGS,0,RTC_FORMAT_UCHAR,hair->flags,0,sizeof(char),hair->numHairs);
  rtcSetGeometryTessellationRate(geom,(float)hair->tessellation_rate);
  rtcSetGeometryEnableFilterFunctionFromArguments(geom,true);
  rtcCommitGeometry(geom);
  rtcAttachGeometry(scene_out,geom);
  rtcReleaseGeometry(geom);
}